

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v5::internal::
       format_decimal<unsigned_long,char,fmt::v5::internal::add_thousands_sep<char>>
                 (char *buffer,unsigned_long value,int num_digits,
                 add_thousands_sep<char> thousands_sep)

{
  bool bVar1;
  assertion_failure *this;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  
  if (num_digits < 0) {
    this = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this,"invalid digit count");
    __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
  }
  pcVar4 = buffer + (uint)num_digits;
  uVar3 = value;
  pcVar5 = pcVar4;
  if (99 < value) {
    do {
      value = uVar3 / 100;
      uVar6 = (ulong)(uint)(((int)uVar3 + (int)value * -100) * 2);
      pcVar5[-1] = basic_data<void>::DIGITS[uVar6 + 1];
      pcVar5 = pcVar5 + -1;
      if (((thousands_sep.digit_index_ + 1) * -0x55555555 < 0x55555556) &&
         (pcVar5 = pcVar5 + -thousands_sep.sep_.size_, thousands_sep.sep_.size_ != 0)) {
        memmove(pcVar5,thousands_sep.sep_.data_,thousands_sep.sep_.size_);
      }
      pcVar5[-1] = basic_data<void>::DIGITS[uVar6];
      pcVar5 = pcVar5 + -1;
      thousands_sep.digit_index_ = thousands_sep.digit_index_ + 2;
      if ((thousands_sep.digit_index_ * -0x55555555 < 0x55555556) &&
         (pcVar5 = pcVar5 + -thousands_sep.sep_.size_, thousands_sep.sep_.size_ != 0)) {
        memmove(pcVar5,thousands_sep.sep_.data_,thousands_sep.sep_.size_);
      }
      bVar1 = 9999 < uVar3;
      uVar3 = value;
    } while (bVar1);
  }
  if (value < 10) {
    bVar2 = (byte)value | 0x30;
  }
  else {
    pcVar5[-1] = basic_data<void>::DIGITS[(value * 2 & 0xffffffff) + 1];
    pcVar5 = pcVar5 + -1;
    if (((thousands_sep.digit_index_ + 1) * -0x55555555 < 0x55555556) &&
       (pcVar5 = pcVar5 + -thousands_sep.sep_.size_, thousands_sep.sep_.size_ != 0)) {
      memmove(pcVar5,thousands_sep.sep_.data_,thousands_sep.sep_.size_);
    }
    bVar2 = basic_data<void>::DIGITS[value * 2 & 0x1fffffffe];
  }
  pcVar5[-1] = bVar2;
  return pcVar4;
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}